

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigint.h
# Opt level: O0

bool __thiscall
fast_float::large_mul<(unsigned_short)62>
          (fast_float *this,stackvec<(unsigned_short)62> *x,limb_span y)

{
  limb_span y_00;
  bool bVar1;
  size_t sVar2;
  unsigned_long *puVar3;
  stackvec<(unsigned_short)62> *x_local;
  limb_span y_local;
  
  y_local.ptr = y.ptr;
  x_local = x;
  sVar2 = span<unsigned_long>::len((span<unsigned_long> *)&x_local);
  if (sVar2 == 1) {
    puVar3 = span<unsigned_long>::operator[]((span<unsigned_long> *)&x_local,0);
    bVar1 = small_mul<(unsigned_short)62>((stackvec<(unsigned_short)62> *)this,*puVar3);
    if (!bVar1) {
      return false;
    }
  }
  else {
    y_00.length = (size_t)y_local.ptr;
    y_00.ptr = x_local->data;
    bVar1 = long_mul<(unsigned_short)62>((stackvec<(unsigned_short)62> *)this,y_00);
    if (!bVar1) {
      return false;
    }
  }
  return true;
}

Assistant:

FASTFLOAT_CONSTEXPR20
bool large_mul(stackvec<size>& x, limb_span y) noexcept {
  if (y.len() == 1) {
    FASTFLOAT_TRY(small_mul(x, y[0]));
  } else {
    FASTFLOAT_TRY(long_mul(x, y));
  }
  return true;
}